

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darLib.c
# Opt level: O3

void Dar_LibStart(void)

{
  if (s_DarLib != (Dar_Lib_t *)0x0) {
    return;
  }
  s_DarLib = Dar_LibRead();
  return;
}

Assistant:

void Dar_LibStart()
{
//    abctime clk = Abc_Clock();
    if ( s_DarLib != NULL )
        return;
    assert( s_DarLib == NULL );
    s_DarLib = Dar_LibRead();
//    printf( "The 4-input library started with %d nodes and %d subgraphs. ", s_DarLib->nObjs - 4, s_DarLib->nSubgrTotal );
//    ABC_PRT( "Time", Abc_Clock() - clk );
}